

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,MemoryAccess access)

{
  _Any_data *this_00;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  Pipeline::Pipeline(__return_storage_ptr__);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1310:17)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1310:17)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1311:17)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1311:17)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1312:17)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1312:17)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  if (access == Read) {
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<n_e_s::core::StepResult_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1336:33)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<n_e_s::core::StepResult_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1336:33)>
               ::_M_manager;
    local_40._M_unused._M_object = this;
    Pipeline::push_conditional(__return_storage_ptr__,(ConditionalStepT *)&local_40);
    this_00 = &local_40;
  }
  else {
    if (access == Write) {
      local_60._8_8_ = 0;
      local_48 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1323:21)>
                 ::_M_invoke;
      local_50 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1323:21)>
                 ::_M_manager;
      local_60._M_unused._M_object = this;
      Pipeline::push(__return_storage_ptr__,(StepT *)&local_60);
    }
    else {
      local_60._8_8_ = 0;
      local_48 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1348:21)>
                 ::_M_invoke;
      local_50 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1348:21)>
                 ::_M_manager;
      local_60._M_unused._M_object = this;
      Pipeline::push(__return_storage_ptr__,(StepT *)&local_60);
      std::_Function_base::~_Function_base((_Function_base *)&local_60);
      local_60._8_8_ = 0;
      local_48 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1360:21)>
                 ::_M_invoke;
      local_50 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1360:21)>
                 ::_M_manager;
      local_60._M_unused._M_object = this;
      Pipeline::push(__return_storage_ptr__,(StepT *)&local_60);
      std::_Function_base::~_Function_base((_Function_base *)&local_60);
      local_60._8_8_ = 0;
      local_48 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1361:21)>
                 ::_M_invoke;
      local_50 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1361:21)>
                 ::_M_manager;
      local_60._M_unused._M_object = this;
      Pipeline::push(__return_storage_ptr__,(StepT *)&local_60);
    }
    this_00 = &local_60;
  }
  std::_Function_base::~_Function_base((_Function_base *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_indirect_indexed_addressing_steps(
        const MemoryAccess access) {
    Pipeline result;
    result.push([this] { tmp_ = mmu_->read_byte(registers_->pc++); });
    result.push([this] { tmp2_ = mmu_->read_byte(tmp_); });
    result.push([this] {
        // The effective address is always fetched from zero page
        const uint16_t upper = mmu_->read_byte(static_cast<uint8_t>(tmp_ + 1u))
                               << 8u;
        const uint16_t address = upper | tmp2_;
        const uint8_t offset = registers_->y;

        is_crossing_page_boundary_ = cross_page(address, offset);
        effective_address_ = address + offset;
    });
    if (access == MemoryAccess::Write) {
        result.push([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
            } else {
                // Extra read from effective address.
                mmu_->read_byte(effective_address_);
            }
        });
    } else if (access == MemoryAccess::Read) {
        result.push_conditional([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
                return StepResult::Continue;
            }
            return StepResult::Skip;
        });
    } else {
        result.push([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
            } else {
                // Extra read from effective address.
                mmu_->read_byte(effective_address_);
            }
        });
        result.push([this] { tmp_ = mmu_->read_byte(effective_address_); });
        result.push([this] { mmu_->write_byte(effective_address_, tmp_); });
    }
    return result;
}